

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *ctrl,size_t capacity)

{
  bool bVar1;
  size_t in_RSI;
  ctrl_t *in_RDI;
  ctrl_t *pos;
  ctrl_t *in_stack_00000028;
  GroupSse2Impl *in_stack_00000030;
  GroupSse2Impl GStack_28;
  ctrl_t *local_18;
  size_t local_10;
  ctrl_t *local_8;
  
  if (in_RDI[in_RSI] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x270,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = IsValidCapacity(in_RSI);
  if (!bVar1) {
    __assert_fail("IsValidCapacity(capacity)",
                  "/workspace/llm4binary/github/license_c_cmakelists/covscript[P]covscript/csbuild/deps/include/covscript/import/parallel_hashmap/phmap.h"
                  ,0x271,"void phmap::priv::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  for (local_18 = local_8; local_18 != local_8 + local_10 + 1; local_18 = local_18 + 0x10) {
    GroupSse2Impl::GroupSse2Impl(&GStack_28,local_18);
    GroupSse2Impl::ConvertSpecialToEmptyAndFullToDeleted(in_stack_00000030,in_stack_00000028);
  }
  *(undefined8 *)(local_8 + local_10 + 1) = *(undefined8 *)local_8;
  *(undefined8 *)(local_8 + local_10 + 9) = *(undefined8 *)(local_8 + 8);
  local_8[local_10] = -1;
  return;
}

Assistant:

inline void ConvertDeletedToEmptyAndFullToDeleted(
		    ctrl_t* ctrl, size_t capacity)
		{
			assert(ctrl[capacity] == kSentinel);
			assert(IsValidCapacity(capacity));
			for (ctrl_t* pos = ctrl; pos != ctrl + capacity + 1; pos += Group::kWidth) {
				Group{pos}.ConvertSpecialToEmptyAndFullToDeleted(pos);
			}
			// Copy the cloned ctrl bytes.
			std::memcpy(ctrl + capacity + 1, ctrl, Group::kWidth);
			ctrl[capacity] = kSentinel;
		}